

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFModulusPoly.cpp
# Opt level: O0

ModulusPoly * __thiscall ZXing::Pdf417::ModulusPoly::add(ModulusPoly *this,ModulusPoly *other)

{
  bool bVar1;
  invalid_argument *this_00;
  size_type sVar2;
  size_type sVar3;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  vector<int,_std::allocator<int>_> *this_01;
  vector<int,_std::allocator<int>_> *pvVar4;
  iterator this_02;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> field;
  vector<int,_std::allocator<int>_> *pvVar5;
  const_reference pvVar6;
  reference pvVar7;
  long *in_RDX;
  long *in_RSI;
  ModulusPoly *in_RDI;
  size_t i;
  size_t lengthDiff;
  vector<int,_std::allocator<int>_> sumDiff;
  vector<int,_std::allocator<int>_> *largerCoefficients;
  vector<int,_std::allocator<int>_> *smallerCoefficients;
  ModulusPoly *in_stack_ffffffffffffff18;
  long lVar8;
  undefined4 in_stack_ffffffffffffff20;
  value_type vVar9;
  int in_stack_ffffffffffffff24;
  allocator_type *in_stack_ffffffffffffff30;
  size_type in_stack_ffffffffffffff38;
  vector<int,_std::allocator<int>_> *pvVar10;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff40;
  vector<int,_std::allocator<int>_> *coefficients;
  vector<int,_std::allocator<int>_> local_50;
  vector<int,_std::allocator<int>_> *local_38;
  vector<int,_std::allocator<int>_> *local_30 [3];
  long *local_18;
  
  if (*in_RSI != *in_RDX) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"ModulusPolys do not have same ModulusGF field")
    ;
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_18 = in_RDX;
  bVar1 = isZero((ModulusPoly *)0x2caac1);
  if (bVar1) {
    ModulusPoly((ModulusPoly *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                in_stack_ffffffffffffff18);
  }
  else {
    bVar1 = isZero((ModulusPoly *)0x2caaeb);
    if (bVar1) {
      ModulusPoly((ModulusPoly *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                  in_stack_ffffffffffffff18);
    }
    else {
      local_30[0] = (vector<int,_std::allocator<int>_> *)(in_RSI + 1);
      local_38 = (vector<int,_std::allocator<int>_> *)(local_18 + 1);
      sVar2 = std::vector<int,_std::allocator<int>_>::size(local_30[0]);
      sVar3 = std::vector<int,_std::allocator<int>_>::size(local_38);
      if (sVar3 < sVar2) {
        std::swap<std::vector<int,std::allocator<int>>const*>(local_30,&local_38);
      }
      __first._M_current = (int *)std::vector<int,_std::allocator<int>_>::size(local_38);
      std::allocator<int>::allocator((allocator<int> *)0x2cab8f);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff40._M_current,
                 in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      std::allocator<int>::~allocator((allocator<int> *)0x2cabb5);
      this_01 = (vector<int,_std::allocator<int>_> *)
                std::vector<int,_std::allocator<int>_>::size(local_38);
      sVar2 = std::vector<int,_std::allocator<int>_>::size(local_30[0]);
      pvVar4 = (vector<int,_std::allocator<int>_> *)((long)this_01 - sVar2);
      std::vector<int,_std::allocator<int>_>::begin
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff18);
      pvVar10 = pvVar4;
      this_02 = std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff18);
      field = std::
              copy_n<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,unsigned_long,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                        (__first,(unsigned_long)pvVar10,in_stack_ffffffffffffff40);
      pvVar10 = pvVar4;
      while( true ) {
        coefficients = pvVar10;
        pvVar5 = (vector<int,_std::allocator<int>_> *)
                 std::vector<int,_std::allocator<int>_>::size(local_38);
        if (pvVar5 <= pvVar10) break;
        lVar8 = *in_RSI;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           (local_30[0],(long)coefficients - (long)pvVar4);
        vVar9 = *pvVar6;
        std::vector<int,_std::allocator<int>_>::operator[](local_38,(size_type)coefficients);
        in_stack_ffffffffffffff24 =
             ModulusGF::add((ModulusGF *)CONCAT44(in_stack_ffffffffffffff24,vVar9),
                            (int)((ulong)lVar8 >> 0x20),(int)lVar8);
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&local_50,(size_type)coefficients);
        *pvVar7 = in_stack_ffffffffffffff24;
        pvVar10 = (vector<int,_std::allocator<int>_> *)
                  ((long)&(coefficients->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start + 1);
      }
      ModulusPoly((ModulusPoly *)this_02._M_current,(ModulusGF *)field._M_current,coefficients);
      std::vector<int,_std::allocator<int>_>::~vector(this_01);
    }
  }
  return in_RDI;
}

Assistant:

ModulusPoly
ModulusPoly::add(const ModulusPoly& other) const
{
	if (_field != other._field) {
		throw std::invalid_argument("ModulusPolys do not have same ModulusGF field");
	}
	if (isZero()) {
		return other;
	}
	if (other.isZero()) {
		return *this;
	}

	auto smallerCoefficients = &_coefficients;
	auto largerCoefficients = &other._coefficients;
	if (smallerCoefficients->size() > largerCoefficients->size()) {
		std::swap(smallerCoefficients, largerCoefficients);
	}
	std::vector<int> sumDiff(largerCoefficients->size());
	size_t lengthDiff = largerCoefficients->size() - smallerCoefficients->size();

	// Copy high-order terms only found in higher-degree polynomial's coefficients
	std::copy_n(largerCoefficients->begin(), lengthDiff, sumDiff.begin());
	for (size_t i = lengthDiff; i < largerCoefficients->size(); i++) {
		sumDiff[i] = _field->add((*smallerCoefficients)[i - lengthDiff], (*largerCoefficients)[i]);
	}
	return ModulusPoly(*_field, sumDiff);
}